

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

vector<char,_std::allocator<char>_> * __thiscall
Liby::Buffer::retriveveAsVector
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,Buffer *this,off_t len)

{
  long lVar1;
  long lVar2;
  allocator_type local_19;
  
  if (len < 0) {
    __assert_fail("len >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                  ,0x106,"std::vector<char> Liby::Buffer::retriveveAsVector(off_t)");
  }
  if (len != 0) {
    lVar1 = this->leftIndex_;
    lVar2 = this->rightIndex_;
    if (lVar2 < lVar1) {
      __assert_fail("rightIndex_ >= leftIndex_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                    ,0x5a,"off_t Liby::Buffer::size() const");
    }
    if (len <= lVar2 - lVar1) {
      std::vector<char,std::allocator<char>>::vector<char*,void>
                ((vector<char,std::allocator<char>> *)__return_storage_ptr__,this->buffer_ + lVar1,
                 this->buffer_ + lVar2,&local_19);
      retrieve(this,len);
      return __return_storage_ptr__;
    }
  }
  retriveveAllAsVector(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> Buffer::retriveveAsVector(off_t len) {
    assert(len >= 0);
    if (len == 0 || len > size())
        return retriveveAllAsVector();
    std::vector<char> ret(&buffer_[leftIndex_], &buffer_[rightIndex_]);
    retrieve(len);
    return ret;
}